

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

Curl_addrinfo * Curl_resolver_getaddrinfo(Curl_easy *data,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  Curl_async *async;
  uchar uVar2;
  time_t *ptVar3;
  _Bool _Var4;
  int iVar5;
  thread_data *ptVar6;
  pthread_mutex_t *__mutex;
  char *pcVar7;
  pthread_t *ppVar8;
  int *piVar9;
  connectdata *pcVar10;
  int iVar11;
  curltime cVar12;
  
  ptVar3 = (time_t *)(data->state).async.resolver;
  *waitp = 0;
  pcVar10 = data->conn;
  iVar5 = 2;
  if (pcVar10->ip_version != '\x01') {
    _Var4 = Curl_ipv6works(data);
    pcVar10 = data->conn;
    if ((_Var4) && (iVar5 = 10, pcVar10->ip_version != '\x02')) {
      iVar5 = 0;
    }
  }
  uVar2 = pcVar10->transport;
  cVar12 = Curl_now();
  *ptVar3 = cVar12.tv_sec;
  *(int *)(ptVar3 + 1) = cVar12.tv_usec;
  ptVar6 = (thread_data *)(*Curl_ccalloc)(1,0x88);
  (data->state).async.tdata = ptVar6;
  iVar11 = 0xc;
  if (ptVar6 != (thread_data *)0x0) {
    (data->state).async.port = port;
    puVar1 = &(data->state).async.field_0x28;
    *puVar1 = *puVar1 & 0xfe;
    (data->state).async.status = 0;
    (data->state).async.dns = (Curl_dns_entry *)0x0;
    ptVar6->thread_hnd = (pthread_t *)0x0;
    (ptVar6->tsd).mtx = (pthread_mutex_t *)0x0;
    (ptVar6->tsd).done = 0;
    (ptVar6->tsd).port = 0;
    (ptVar6->tsd).hostname = (char *)0x0;
    (ptVar6->tsd).data = (Curl_easy *)0x0;
    (ptVar6->tsd).sock_pair[0] = 0;
    (ptVar6->tsd).sock_pair[1] = 0;
    *(undefined8 *)&(ptVar6->tsd).sock_error = 0;
    (ptVar6->tsd).res = (Curl_addrinfo *)0x0;
    (ptVar6->tsd).td = ptVar6;
    (ptVar6->tsd).port = port;
    (ptVar6->tsd).done = 1;
    (ptVar6->tsd).hints.ai_flags = 0;
    (ptVar6->tsd).hints.ai_family = iVar5;
    (ptVar6->tsd).hints.ai_socktype = (uVar2 != '\x03') + 1;
    (ptVar6->tsd).hints.ai_protocol = 0;
    (ptVar6->tsd).hints.ai_addrlen = 0;
    *(undefined8 *)&(ptVar6->tsd).hints.field_0x14 = 0;
    *(undefined8 *)((long)&(ptVar6->tsd).hints.ai_addr + 4) = 0;
    *(undefined8 *)((long)&(ptVar6->tsd).hints.ai_canonname + 4) = 0;
    *(undefined4 *)((long)&(ptVar6->tsd).hints.ai_next + 4) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    (ptVar6->tsd).mtx = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
      iVar5 = Curl_pipe((ptVar6->tsd).sock_pair,false);
      if (iVar5 < 0) {
        (ptVar6->tsd).sock_pair[0] = -1;
        (ptVar6->tsd).sock_pair[1] = -1;
      }
      else {
        (ptVar6->tsd).sock_error = 0;
        pcVar7 = (*Curl_cstrdup)(hostname);
        (ptVar6->tsd).hostname = pcVar7;
        if (pcVar7 != (char *)0x0) {
          async = &(data->state).async;
          (*Curl_cfree)(async->hostname);
          pcVar7 = (*Curl_cstrdup)(hostname);
          async->hostname = pcVar7;
          if (pcVar7 == (char *)0x0) {
            iVar11 = 0xc;
          }
          else {
            (ptVar6->tsd).done = 0;
            ppVar8 = Curl_thread_create(getaddrinfo_thread,&ptVar6->tsd);
            ptVar6->thread_hnd = ppVar8;
            if (ppVar8 != (pthread_t *)0x0) {
              *waitp = 1;
              return (Curl_addrinfo *)0x0;
            }
            (ptVar6->tsd).done = 1;
            piVar9 = __errno_location();
            iVar11 = *piVar9;
          }
          destroy_async_data(async);
          goto LAB_00111d74;
        }
      }
    }
    iVar5 = (ptVar6->tsd).sock_pair[0];
    if (iVar5 != -1) {
      close(iVar5);
      (ptVar6->tsd).sock_pair[0] = -1;
    }
    destroy_thread_sync_data(&ptVar6->tsd);
    (data->state).async.tdata = (thread_data *)0x0;
    (*Curl_cfree)(ptVar6);
  }
LAB_00111d74:
  piVar9 = __errno_location();
  *piVar9 = iVar11;
  Curl_failf(data,"getaddrinfo() thread failed to start");
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_resolver_getaddrinfo(struct Curl_easy *data,
                                                const char *hostname,
                                                int port,
                                                int *waitp)
{
  struct addrinfo hints;
  int pf = PF_INET;
  struct resdata *reslv = (struct resdata *)data->state.async.resolver;

  *waitp = 0; /* default to synchronous response */

#ifdef CURLRES_IPV6
  if((data->conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* The stack seems to be IPv6-enabled */
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
    else
      pf = PF_UNSPEC;
  }
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (data->conn->transport == TRNSPRT_TCP)?
    SOCK_STREAM : SOCK_DGRAM;

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(data, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start");
  return NULL;

}